

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::CommandLineInterface::Run
          (CommandLineInterface *this,int argc,char **argv)

{
  ErrorFormat EVar1;
  pointer pbVar2;
  GeneratorContextImpl *pGVar3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  __node_base _Var6;
  pointer puVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  ParseArgumentStatus PVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  ostream *poVar17;
  char *pcVar18;
  size_t sVar19;
  SimpleDescriptorDatabase *this_00;
  Type *pTVar20;
  MergedDescriptorDatabase *this_01;
  MultiFileErrorCollector *pMVar21;
  SourceTreeDescriptorDatabase *this_02;
  LogMessage *pLVar22;
  pointer pOVar23;
  mapped_type *pmVar24;
  GeneratorContextImpl *pGVar25;
  DescriptorProto *pDVar26;
  FileDescriptor *pFVar27;
  _Rb_tree_header *p_Var28;
  ulong uVar29;
  DiskSourceTree *extraout_RDX;
  DiskSourceTree *extraout_RDX_00;
  DiskSourceTree *source_tree;
  undefined8 *puVar30;
  unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
  *db;
  pointer pbVar31;
  pointer puVar32;
  ulong uVar33;
  long lVar34;
  SimpleDescriptorDatabase *pSVar35;
  int iVar36;
  long lVar37;
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  descriptor_pool;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  databases_per_descriptor_set;
  GeneratorContextMap output_directories;
  FileDescriptorSet file_descriptor_set;
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  raw_databases_per_descriptor_set;
  DiskSourceTree *local_280;
  DescriptorPool *local_260;
  LogFinisher local_249;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_248;
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  local_228;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_210;
  undefined1 local_1d8 [24];
  int local_1c0;
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168 [10];
  ArenaStringPtr local_c8 [5];
  LogMessage local_a0;
  LogMessage local_68;
  
  Clear(this);
  PVar13 = ParseArguments(this,argc,argv);
  if (PVar13 == PARSE_ARGUMENT_DONE_AND_EXIT) {
    return 0;
  }
  if (PVar13 == PARSE_ARGUMENT_FAIL) {
    return 1;
  }
  local_248.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = (MergedDescriptorDatabase *)0x0;
  local_248.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_260 = (DescriptorPool *)0x0;
  local_228.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar31 = (this->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->descriptor_set_in_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar31 != pbVar2) {
LAB_002314ed:
    do {
      iVar14 = open((pbVar31->_M_dataplus)._M_p,0);
      if (iVar14 < 0) {
        piVar16 = __errno_location();
        if (*piVar16 == 4) goto LAB_002314ed;
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(pbVar31->_M_dataplus)._M_p,
                             pbVar31->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,": ",2);
        pcVar18 = strerror(2);
        if (pcVar18 == (char *)0x0) {
          std::ios::clear((int)poVar17 + (int)*(undefined8 *)(*(long *)poVar17 + -0x18));
        }
        else {
          sVar19 = strlen(pcVar18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar18,sVar19);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        local_210._M_buckets = (__buckets_ptr)0x0;
      }
      else {
        FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_1d8,(Arena *)0x0,false);
        bVar12 = MessageLite::ParseFromFileDescriptor((MessageLite *)local_1d8,iVar14);
        iVar14 = close(iVar14);
        if (iVar14 == 0) {
          if (!bVar12) {
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(pbVar31->_M_dataplus)._M_p,
                                 pbVar31->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,": Unable to parse.",0x12);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
            std::ostream::put((char)poVar17);
            std::ostream::flush();
            goto LAB_002317a8;
          }
          this_00 = (SimpleDescriptorDatabase *)operator_new(0xb0);
          SimpleDescriptorDatabase::SimpleDescriptorDatabase(this_00);
          if (0 < local_1c0) {
            iVar14 = 0;
            do {
              FileDescriptorProto::FileDescriptorProto
                        ((FileDescriptorProto *)local_178,(Arena *)0x0,false);
              pTVar20 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                                  ((RepeatedPtrFieldBase *)(local_1d8 + 0x10),iVar14);
              iVar15 = (*(this_00->super_DescriptorDatabase)._vptr_DescriptorDatabase[2])
                                 (this_00,(ulong)(pTVar20->name_).tagged_ptr_.ptr_ &
                                          0xfffffffffffffffe,(FileDescriptorProto *)local_178);
              iVar36 = 6;
              if ((char)iVar15 == '\0') {
                pTVar20 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                                    ((RepeatedPtrFieldBase *)(local_1d8 + 0x10),iVar14);
                bVar12 = SimpleDescriptorDatabase::Add(this_00,pTVar20);
                iVar36 = 0;
                if (!bVar12) {
                  local_210._M_buckets = (__buckets_ptr)0x0;
                  iVar36 = 1;
                }
              }
              FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_178);
              if ((iVar36 != 6) && (pSVar35 = this_00, iVar36 != 0)) goto LAB_002316ac;
              iVar14 = iVar14 + 1;
            } while (iVar14 < local_1c0);
          }
          pSVar35 = (SimpleDescriptorDatabase *)0x0;
          local_210._M_buckets = (__buckets_ptr)this_00;
LAB_002316ac:
          if (pSVar35 != (SimpleDescriptorDatabase *)0x0) {
            (*(pSVar35->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])(pSVar35);
          }
        }
        else {
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,(pbVar31->_M_dataplus)._M_p,
                               pbVar31->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,": close: ",9);
          piVar16 = __errno_location();
          pcVar18 = strerror(*piVar16);
          if (pcVar18 == (char *)0x0) {
            std::ios::clear((int)poVar17 + (int)*(undefined8 *)(*(long *)poVar17 + -0x18));
          }
          else {
            sVar19 = strlen(pcVar18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar18,sVar19);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
          std::ostream::put((char)poVar17);
          std::ostream::flush();
LAB_002317a8:
          local_210._M_buckets = (__buckets_ptr)0x0;
        }
        FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_1d8);
      }
      if ((SimpleDescriptorDatabase *)local_210._M_buckets == (SimpleDescriptorDatabase *)0x0) {
        iVar14 = 1;
        this_02 = (SourceTreeDescriptorDatabase *)0x0;
        this_01 = (MergedDescriptorDatabase *)0x0;
        pMVar21 = (MultiFileErrorCollector *)0x0;
        local_280 = (DiskSourceTree *)0x0;
        goto LAB_002321af;
      }
      std::
      vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>,std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>>
      ::
      emplace_back<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>
                ((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>,std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>>
                  *)&local_228,
                 (unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                  *)&local_210);
      if ((SimpleDescriptorDatabase *)local_210._M_buckets != (SimpleDescriptorDatabase *)0x0) {
        (*((DescriptorDatabase *)local_210._M_buckets)->_vptr_DescriptorDatabase[1])();
      }
      pbVar31 = pbVar31 + 1;
    } while (pbVar31 != pbVar2);
    local_178._0_8_ = (pointer)0x0;
    local_178._8_8_ = (DescriptorDatabase **)0x0;
    local_168[0]._M_allocated_capacity = (DescriptorDatabase **)0x0;
    std::
    vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ::reserve((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
               *)local_178,
              (long)local_228.
                    super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_228.
                    super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar7 = local_228.
             super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_228.
        super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_228.
        super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar32 = local_228.
                super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_1d8._0_8_ =
             (puVar32->_M_t).
             super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
             .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>.
             _M_head_impl;
        if (local_178._8_8_ == local_168[0]._M_allocated_capacity) {
          std::
          vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
          ::_M_realloc_insert<google::protobuf::DescriptorDatabase*>
                    ((vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
                      *)local_178,(iterator)local_178._8_8_,(DescriptorDatabase **)local_1d8);
        }
        else {
          *(undefined8 *)local_178._8_8_ = local_1d8._0_8_;
          local_178._8_8_ = local_178._8_8_ + 8;
        }
        puVar32 = puVar32 + 1;
      } while (puVar32 != puVar7);
    }
    this_01 = (MergedDescriptorDatabase *)operator_new(0x20);
    MergedDescriptorDatabase::MergedDescriptorDatabase
              (this_01,(vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                        *)local_178);
    if ((pointer)local_178._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_178._0_8_);
    }
  }
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar12 = VerifyInputFilesInDescriptors(this,&this_01->super_DescriptorDatabase);
    if (bVar12) {
      pMVar21 = (MultiFileErrorCollector *)operator_new(0x30);
      EVar1 = this->error_format_;
      pMVar21->_vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_004dc2d0;
      pMVar21[1]._vptr_MultiFileErrorCollector = (_func_int **)&DAT_004dc320;
      pMVar21[2]._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_004dc350;
      *(ErrorFormat *)&pMVar21[3]._vptr_MultiFileErrorCollector = EVar1;
      pMVar21[4]._vptr_MultiFileErrorCollector = (_func_int **)0x0;
      *(undefined2 *)&pMVar21[5]._vptr_MultiFileErrorCollector = 0;
      local_260 = (DescriptorPool *)operator_new(0x60);
      DescriptorPool::DescriptorPool
                (local_260,&this_01->super_DescriptorDatabase,(ErrorCollector *)(pMVar21 + 2));
      this_02 = (SourceTreeDescriptorDatabase *)0x0;
      local_280 = (DiskSourceTree *)0x0;
      source_tree = extraout_RDX_00;
      goto LAB_00231aa8;
    }
    local_280 = (DiskSourceTree *)0x0;
  }
  else {
    local_280 = (DiskSourceTree *)operator_new(0x40);
    DiskSourceTree::DiskSourceTree(local_280);
    bVar12 = InitializeDiskSourceTree(this,local_280,&this_01->super_DescriptorDatabase);
    if (bVar12) {
      pMVar21 = (MultiFileErrorCollector *)operator_new(0x30);
      EVar1 = this->error_format_;
      pMVar21->_vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_004dc2d0;
      pMVar21[1]._vptr_MultiFileErrorCollector = (_func_int **)&DAT_004dc320;
      pMVar21[2]._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_004dc350;
      *(ErrorFormat *)&pMVar21[3]._vptr_MultiFileErrorCollector = EVar1;
      pMVar21[4]._vptr_MultiFileErrorCollector = (_func_int **)local_280;
      *(undefined2 *)&pMVar21[5]._vptr_MultiFileErrorCollector = 0;
      this_02 = (SourceTreeDescriptorDatabase *)operator_new(0x98);
      SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase
                (this_02,(SourceTree *)local_280,&this_01->super_DescriptorDatabase);
      this_02->error_collector_ = pMVar21;
      local_260 = (DescriptorPool *)operator_new(0x60);
      this_02->using_validation_error_collector_ = true;
      DescriptorPool::DescriptorPool
                (local_260,(DescriptorDatabase *)this_02,
                 &(this_02->validation_error_collector_).super_ErrorCollector);
      source_tree = extraout_RDX;
LAB_00231aa8:
      local_260->enforce_weak_ = true;
      bVar12 = ParseInputFiles(this,local_260,source_tree,&local_248);
      iVar14 = 1;
      if (!bVar12) goto LAB_002321af;
      local_210._M_buckets = &local_210._M_single_bucket;
      local_210._M_bucket_count = 1;
      local_210._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_210._M_element_count = 0;
      local_210._M_rehash_policy._M_max_load_factor = 1.0;
      local_210._M_rehash_policy._M_next_resize = 0;
      local_210._M_single_bucket = (__node_base_ptr)0x0;
      _Var6._M_nxt = local_210._M_before_begin._M_nxt;
      if ((this->mode_ == MODE_COMPILE) &&
         (pOVar23 = (this->output_directives_).
                    super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (this->output_directives_).
         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
         ._M_impl.super__Vector_impl_data._M_finish != pOVar23)) {
        lVar34 = 0;
        uVar33 = 0;
        do {
          lVar37 = *(long *)((long)&(pOVar23->output_location)._M_dataplus._M_p + lVar34);
          local_178._0_8_ = local_178 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_178,lVar37,
                     *(long *)((long)&(pOVar23->output_location)._M_string_length + lVar34) + lVar37
                    );
          uVar10 = local_178._8_8_;
          uVar8 = local_178._0_8_;
          if ((long)local_178._8_8_ < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (local_178._8_8_,"string length exceeds max size");
          }
          uVar11 = local_178._8_8_;
          uVar9 = local_178._0_8_;
          if (((ulong)uVar10 < (DescriptorDatabase **)0x4) ||
             (*(int *)(uVar8 + uVar10 + -4) != 0x70697a2e)) {
            if ((long)local_178._8_8_ < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (local_178._8_8_,"string length exceeds max size");
            }
            uVar10 = local_178._8_8_;
            uVar8 = local_178._0_8_;
            if (((ulong)uVar11 < (DescriptorDatabase **)0x4) ||
               (*(int *)(uVar9 + uVar11 + -4) != 0x72616a2e)) {
              if ((long)local_178._8_8_ < 0) {
                stringpiece_internal::StringPiece::LogFatalSizeTooBig
                          (local_178._8_8_,"string length exceeds max size");
              }
              if (((((ulong)uVar10 < (DescriptorDatabase **)0x7) ||
                   (*(int *)(uVar8 + uVar10 + -4) != 0x72616a63 ||
                    *(int *)(uVar8 + uVar10 + -7) != 0x6372732e)) &&
                  ((DescriptorDatabase **)local_178._8_8_ != (DescriptorDatabase **)0x0)) &&
                 (*(char *)(local_178._0_8_ + local_178._8_8_ + -1) != '/')) {
                std::__cxx11::string::push_back((char)(key_type *)local_178);
              }
            }
          }
          pmVar24 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&local_210,(key_type *)local_178);
          if ((pmVar24->_M_t).
              super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
              .
              super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
              ._M_head_impl == (GeneratorContextImpl *)0x0) {
            pGVar25 = (GeneratorContextImpl *)operator_new(0x48);
            (pGVar25->super_GeneratorContext)._vptr_GeneratorContext =
                 (_func_int **)&PTR__GeneratorContextImpl_004dc200;
            p_Var28 = &(pGVar25->files_)._M_t._M_impl.super__Rb_tree_header;
            (pGVar25->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (pGVar25->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (pGVar25->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var28->_M_header;
            (pGVar25->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var28->_M_header;
            (pGVar25->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            pGVar25->parsed_files_ = &local_248;
            pGVar25->had_error_ = false;
            pGVar3 = (pmVar24->_M_t).
                     super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
                     ._M_head_impl;
            (pmVar24->_M_t).
            super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
            .
            super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
            ._M_head_impl = pGVar25;
            if (pGVar3 != (GeneratorContextImpl *)0x0) {
              (*(pGVar3->super_GeneratorContext)._vptr_GeneratorContext[1])();
            }
          }
          bVar12 = GenerateOutput(this,&local_248,
                                  (OutputDirective *)
                                  ((long)&(((this->output_directives_).
                                            super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->name).
                                          _M_dataplus._M_p + lVar34),
                                  &((pmVar24->_M_t).
                                    super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
                                   ._M_head_impl)->super_GeneratorContext);
          if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
            operator_delete((void *)local_178._0_8_);
          }
          if (!bVar12) goto LAB_00231f34;
          uVar33 = uVar33 + 1;
          pOVar23 = (this->output_directives_).
                    super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar29 = ((long)(this->output_directives_).
                          super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar23 >> 3) *
                   0x4ec4ec4ec4ec4ec5;
          lVar34 = lVar34 + 0x68;
          _Var6._M_nxt = local_210._M_before_begin._M_nxt;
        } while (uVar33 <= uVar29 && uVar29 - uVar33 != 0);
      }
      for (; _Var6._M_nxt != (_Hash_node_base *)0x0; _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt) {
        pGVar3 = (GeneratorContextImpl *)_Var6._M_nxt[5]._M_nxt;
        p_Var4 = _Var6._M_nxt[1]._M_nxt;
        p_Var5 = _Var6._M_nxt[2]._M_nxt;
        if ((long)p_Var5 < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    ((size_t)p_Var5,"string length exceeds max size");
        }
        if ((p_Var5 == (_Hash_node_base *)0x0) ||
           (((undefined1 *)((long)&p_Var4[-1]._M_nxt + 7))[(long)p_Var5] != '/')) {
          p_Var4 = _Var6._M_nxt[1]._M_nxt;
          p_Var5 = _Var6._M_nxt[2]._M_nxt;
          if ((long)p_Var5 < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      ((size_t)p_Var5,"string length exceeds max size");
          }
          if (((_Hash_node_base *)0x3 < p_Var5) &&
             (*(int *)((undefined1 *)((long)&p_Var4[-1]._M_nxt + 4) + (long)p_Var5) == 0x72616a2e))
          {
            GeneratorContextImpl::AddJarManifest(pGVar3);
          }
          bVar12 = GeneratorContextImpl::WriteAllToZip(pGVar3,(string *)(_Var6._M_nxt + 1));
        }
        else {
          bVar12 = GeneratorContextImpl::WriteAllToDisk(pGVar3,(string *)(_Var6._M_nxt + 1));
        }
        if (bVar12 == false) goto LAB_00231f34;
      }
      if ((this->dependency_out_name_)._M_string_length != 0) {
        if (local_280 == (DiskSourceTree *)0x0) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,1099);
          pLVar22 = internal::LogMessage::operator<<
                              (&local_68,"CHECK failed: disk_source_tree.get(): ");
          internal::LogFinisher::operator=((LogFinisher *)local_178,pLVar22);
          internal::LogMessage::~LogMessage(&local_68);
        }
        bVar12 = GenerateDependencyManifestFile
                           (this,&local_248,(GeneratorContextMap *)&local_210,local_280);
        iVar14 = 1;
        if (!bVar12) goto LAB_002321a0;
      }
      if ((this->descriptor_set_out_name_)._M_string_length != 0) {
        bVar12 = WriteDescriptorSet(this,&local_248);
        iVar14 = 1;
        if (!bVar12) goto LAB_002321a0;
      }
      if (this->mode_ - MODE_ENCODE < 2) {
        if ((this->codec_type_)._M_string_length == 0) {
          DescriptorPool::DescriptorPool((DescriptorPool *)local_1d8);
          FileDescriptorProto::FileDescriptorProto
                    ((FileDescriptorProto *)local_178,(Arena *)0x0,false);
          local_168[0]._M_allocated_capacity = local_168[0]._M_allocated_capacity | 1;
          puVar30 = (undefined8 *)(local_178._8_8_ & 0xfffffffffffffffc);
          if ((local_178._8_8_ & 1) != 0) {
            puVar30 = (undefined8 *)*puVar30;
          }
          internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                    (local_c8,"empty_message.proto",puVar30);
          pDVar26 = FileDescriptorProto::add_message_type((FileDescriptorProto *)local_178);
          *(byte *)(pDVar26->_has_bits_).has_bits_ = (byte)(pDVar26->_has_bits_).has_bits_[0] | 1;
          uVar33 = (pDVar26->super_Message).super_MessageLite._internal_metadata_.ptr_;
          puVar30 = (undefined8 *)(uVar33 & 0xfffffffffffffffc);
          if ((uVar33 & 1) != 0) {
            puVar30 = (undefined8 *)*puVar30;
          }
          internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                    (&pDVar26->name_,"EmptyMessage",puVar30);
          pFVar27 = DescriptorPool::BuildFile
                              ((DescriptorPool *)local_1d8,(FileDescriptorProto *)local_178);
          if (pFVar27 == (FileDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      (&local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x45f);
            pLVar22 = internal::LogMessage::operator<<
                                (&local_a0,"CHECK failed: pool.BuildFile(file) != NULL: ");
            internal::LogFinisher::operator=(&local_249,pLVar22);
            internal::LogMessage::~LogMessage(&local_a0);
          }
          std::__cxx11::string::operator=((string *)&this->codec_type_,"EmptyMessage");
          bVar12 = EncodeOrDecode(this,(DescriptorPool *)local_1d8);
          FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_178);
          DescriptorPool::~DescriptorPool((DescriptorPool *)local_1d8);
          iVar14 = 1;
          if (bVar12) goto LAB_00232098;
        }
        else {
          bVar12 = EncodeOrDecode(this,local_260);
          iVar14 = 1;
          if (bVar12) goto LAB_00232098;
        }
      }
      else {
LAB_00232098:
        iVar14 = 1;
        if ((*(char *)&pMVar21[5]._vptr_MultiFileErrorCollector == '\0') &&
           (((this->fatal_warnings_ != true ||
             (*(char *)((long)&pMVar21[5]._vptr_MultiFileErrorCollector + 1) == '\0')) &&
            (iVar14 = 0, this->mode_ == MODE_PRINT)))) {
          if (this->print_mode_ == PRINT_NONE) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_178,LOGLEVEL_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x47b);
            pLVar22 = internal::LogMessage::operator<<
                                ((LogMessage *)local_178,
                                 "If the code reaches here, it usually means a bug of flag parsing in the CommandLineInterface."
                                );
            internal::LogFinisher::operator=((LogFinisher *)local_1d8,pLVar22);
            internal::LogMessage::~LogMessage((LogMessage *)local_178);
            iVar14 = 1;
          }
          else if ((this->print_mode_ == PRINT_FREE_FIELDS) &&
                  (local_248.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                   local_248.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)) {
            uVar33 = 0;
            iVar14 = 0;
            do {
              pFVar27 = local_248.
                        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar33];
              if (0 < *(int *)(pFVar27 + 0x2c)) {
                lVar37 = 0;
                lVar34 = 0;
                do {
                  PrintFreeFieldNumbers(this,(Descriptor *)(*(long *)(pFVar27 + 0x58) + lVar37));
                  lVar34 = lVar34 + 1;
                  lVar37 = lVar37 + 0x88;
                } while (lVar34 < *(int *)(pFVar27 + 0x2c));
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 < (ulong)((long)local_248.
                                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_248.
                                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
        }
      }
LAB_002321a0:
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_210);
      goto LAB_002321af;
    }
  }
  pMVar21 = (MultiFileErrorCollector *)0x0;
  this_02 = (SourceTreeDescriptorDatabase *)0x0;
  iVar14 = 1;
LAB_002321af:
  if (this_02 != (SourceTreeDescriptorDatabase *)0x0) {
    (*(this_02->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])();
  }
  if (this_01 != (MergedDescriptorDatabase *)0x0) {
    (*(this_01->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])(this_01);
  }
  std::
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ::~vector(&local_228);
  if (local_260 != (DescriptorPool *)0x0) {
    DescriptorPool::~DescriptorPool(local_260);
    operator_delete(local_260);
  }
  if (pMVar21 != (MultiFileErrorCollector *)0x0) {
    (*pMVar21->_vptr_MultiFileErrorCollector[1])(pMVar21);
  }
  if (local_280 != (DiskSourceTree *)0x0) {
    (*(local_280->super_SourceTree)._vptr_SourceTree[1])(local_280);
  }
  if (local_248.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar14;
LAB_00231f34:
  iVar14 = 1;
  goto LAB_002321a0;
}

Assistant:

int CommandLineInterface::Run(int argc, const char* const argv[]) {
  Clear();
  switch (ParseArguments(argc, argv)) {
    case PARSE_ARGUMENT_DONE_AND_EXIT:
      return 0;
    case PARSE_ARGUMENT_FAIL:
      return 1;
    case PARSE_ARGUMENT_DONE_AND_CONTINUE:
      break;
  }

  std::vector<const FileDescriptor*> parsed_files;
  std::unique_ptr<DiskSourceTree> disk_source_tree;
  std::unique_ptr<ErrorPrinter> error_collector;
  std::unique_ptr<DescriptorPool> descriptor_pool;

  // The SimpleDescriptorDatabases here are the constituents of the
  // MergedDescriptorDatabase descriptor_set_in_database, so this vector is for
  // managing their lifetimes. Its scope should match descriptor_set_in_database
  std::vector<std::unique_ptr<SimpleDescriptorDatabase>>
      databases_per_descriptor_set;
  std::unique_ptr<MergedDescriptorDatabase> descriptor_set_in_database;

  std::unique_ptr<SourceTreeDescriptorDatabase> source_tree_database;

  // Any --descriptor_set_in FileDescriptorSet objects will be used as a
  // fallback to input_files on command line, so create that db first.
  if (!descriptor_set_in_names_.empty()) {
    for (const std::string& name : descriptor_set_in_names_) {
      std::unique_ptr<SimpleDescriptorDatabase> database_for_descriptor_set =
          PopulateSingleSimpleDescriptorDatabase(name);
      if (!database_for_descriptor_set) {
        return EXIT_FAILURE;
      }
      databases_per_descriptor_set.push_back(
          std::move(database_for_descriptor_set));
    }

    std::vector<DescriptorDatabase*> raw_databases_per_descriptor_set;
    raw_databases_per_descriptor_set.reserve(
        databases_per_descriptor_set.size());
    for (const std::unique_ptr<SimpleDescriptorDatabase>& db :
         databases_per_descriptor_set) {
      raw_databases_per_descriptor_set.push_back(db.get());
    }
    descriptor_set_in_database.reset(
        new MergedDescriptorDatabase(raw_databases_per_descriptor_set));
  }

  if (proto_path_.empty()) {
    // If there are no --proto_path flags, then just look in the specified
    // --descriptor_set_in files.  But first, verify that the input files are
    // there.
    if (!VerifyInputFilesInDescriptors(descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector.reset(new ErrorPrinter(error_format_));
    descriptor_pool.reset(new DescriptorPool(descriptor_set_in_database.get(),
                                             error_collector.get()));
  } else {
    disk_source_tree.reset(new DiskSourceTree());
    if (!InitializeDiskSourceTree(disk_source_tree.get(),
                                  descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector.reset(
        new ErrorPrinter(error_format_, disk_source_tree.get()));

    source_tree_database.reset(new SourceTreeDescriptorDatabase(
        disk_source_tree.get(), descriptor_set_in_database.get()));
    source_tree_database->RecordErrorsTo(error_collector.get());

    descriptor_pool.reset(new DescriptorPool(
        source_tree_database.get(),
        source_tree_database->GetValidationErrorCollector()));
  }

  descriptor_pool->EnforceWeakDependencies(true);
  if (!ParseInputFiles(descriptor_pool.get(), disk_source_tree.get(),
                       &parsed_files)) {
    return 1;
  }


  // We construct a separate GeneratorContext for each output location.  Note
  // that two code generators may output to the same location, in which case
  // they should share a single GeneratorContext so that OpenForInsert() works.
  GeneratorContextMap output_directories;

  // Generate output.
  if (mode_ == MODE_COMPILE) {
    for (int i = 0; i < output_directives_.size(); i++) {
      std::string output_location = output_directives_[i].output_location;
      if (!HasSuffixString(output_location, ".zip") &&
          !HasSuffixString(output_location, ".jar") &&
          !HasSuffixString(output_location, ".srcjar")) {
        AddTrailingSlash(&output_location);
      }

      auto& generator = output_directories[output_location];

      if (!generator) {
        // First time we've seen this output location.
        generator.reset(new GeneratorContextImpl(parsed_files));
      }

      if (!GenerateOutput(parsed_files, output_directives_[i],
                          generator.get())) {
        return 1;
      }
    }
  }

  // Write all output to disk.
  for (const auto& pair : output_directories) {
    const std::string& location = pair.first;
    GeneratorContextImpl* directory = pair.second.get();
    if (HasSuffixString(location, "/")) {
      if (!directory->WriteAllToDisk(location)) {
        return 1;
      }
    } else {
      if (HasSuffixString(location, ".jar")) {
        directory->AddJarManifest();
      }

      if (!directory->WriteAllToZip(location)) {
        return 1;
      }
    }
  }

  if (!dependency_out_name_.empty()) {
    GOOGLE_DCHECK(disk_source_tree.get());
    if (!GenerateDependencyManifestFile(parsed_files, output_directories,
                                        disk_source_tree.get())) {
      return 1;
    }
  }

  if (!descriptor_set_out_name_.empty()) {
    if (!WriteDescriptorSet(parsed_files)) {
      return 1;
    }
  }

  if (mode_ == MODE_ENCODE || mode_ == MODE_DECODE) {
    if (codec_type_.empty()) {
      // HACK:  Define an EmptyMessage type to use for decoding.
      DescriptorPool pool;
      FileDescriptorProto file;
      file.set_name("empty_message.proto");
      file.add_message_type()->set_name("EmptyMessage");
      GOOGLE_CHECK(pool.BuildFile(file) != NULL);
      codec_type_ = "EmptyMessage";
      if (!EncodeOrDecode(&pool)) {
        return 1;
      }
    } else {
      if (!EncodeOrDecode(descriptor_pool.get())) {
        return 1;
      }
    }
  }

  if (error_collector->FoundErrors() ||
      (fatal_warnings_ && error_collector->FoundWarnings())) {
    return 1;
  }

  if (mode_ == MODE_PRINT) {
    switch (print_mode_) {
      case PRINT_FREE_FIELDS:
        for (int i = 0; i < parsed_files.size(); ++i) {
          const FileDescriptor* fd = parsed_files[i];
          for (int j = 0; j < fd->message_type_count(); ++j) {
            PrintFreeFieldNumbers(fd->message_type(j));
          }
        }
        break;
      case PRINT_NONE:
        GOOGLE_LOG(ERROR) << "If the code reaches here, it usually means a bug of "
                      "flag parsing in the CommandLineInterface.";
        return 1;

        // Do not add a default case.
    }
  }

  return 0;
}